

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  DataKey DVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint *puVar11;
  pointer pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  steeppr *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_4dc;
  undefined1 local_4b8 [32];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [13];
  undefined3 uStack_44b;
  int iStack_448;
  bool bStack_444;
  undefined8 local_440;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  steeppr local_230 [112];
  int local_1c0;
  byte local_1bc;
  ulong local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  byte local_3c;
  ulong local_38;
  
  bVar18 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  local_440 = 0x1c00000000;
  local_4b8._0_16_ = (undefined1  [16])0x0;
  local_4b8._16_16_ = (undefined1  [16])0x0;
  local_498 = (undefined1  [16])0x0;
  local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  local_468 = (undefined1  [16])0x0;
  local_458 = SUB1613((undefined1  [16])0x0,0);
  uStack_44b = 0;
  iStack_448 = 0;
  bStack_444 = false;
  lVar9 = (long)(this->bestPricesCo).super_IdxSet.num;
  if (lVar9 < 1) {
    local_4dc = -1;
  }
  else {
    uVar10 = lVar9 + 1;
    local_4dc = -1;
    do {
      piVar6 = (this->bestPricesCo).super_IdxSet.idx;
      iVar5 = piVar6[uVar10 - 2];
      pnVar12 = pnVar2 + iVar5;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
      }
      iStack_448 = pnVar2[iVar5].m_backend.exp;
      bStack_444 = pnVar2[iVar5].m_backend.neg;
      local_440._0_4_ = pnVar2[iVar5].m_backend.fpclass;
      local_440._4_4_ = pnVar2[iVar5].m_backend.prec_elem;
      pnVar13 = tol;
      pcVar14 = &local_430;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
      }
      local_430.exp = (tol->m_backend).exp;
      local_430.neg = (tol->m_backend).neg;
      local_430.fpclass = (tol->m_backend).fpclass;
      local_430.prec_elem = (tol->m_backend).prec_elem;
      if (local_430.data._M_elems[0] != 0 || local_430.fpclass != 0) {
        local_430.neg = (bool)(local_430.neg ^ 1);
      }
      if ((fpclass_type)local_440 == 2 || local_430.fpclass == 2) {
LAB_005a8cec:
        iVar4 = (this->bestPricesCo).super_IdxSet.num;
        (this->bestPricesCo).super_IdxSet.num = iVar4 + -1;
        piVar6[uVar10 - 2] = piVar6[(long)iVar4 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar5] = 0;
      }
      else {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_430);
        if (-1 < iVar4) {
          piVar6 = (this->bestPricesCo).super_IdxSet.idx;
          goto LAB_005a8cec;
        }
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        psVar15 = local_b0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(uint *)psVar15 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
        }
        local_40 = iStack_448;
        local_3c = bStack_444;
        local_38 = local_440;
        pnVar12 = pnVar3 + iVar5;
        pnVar13 = &local_130;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar3[iVar5].m_backend.exp;
        local_130.m_backend.neg = pnVar3[iVar5].m_backend.neg;
        local_130.m_backend.fpclass = pnVar3[iVar5].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar3[iVar5].m_backend.prec_elem;
        pnVar13 = tol;
        pnVar16 = &local_1b0;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (tol->m_backend).exp;
        local_1b0.m_backend.neg = (tol->m_backend).neg;
        local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_430,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar14 = &local_430;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
        }
        iStack_448 = local_430.exp;
        bStack_444 = local_430.neg;
        local_440._0_4_ = local_430.fpclass;
        local_440._4_4_ = local_430.prec_elem;
        uVar8 = local_430._120_8_;
        if ((local_430.fpclass != 2) && ((best->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4b8,&best->m_backend);
          uVar8 = local_440 & 0xffffffff;
          if (0 < iVar4) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
            pnVar13 = best;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
            }
            (best->m_backend).exp = iStack_448;
            (best->m_backend).neg = bStack_444;
            (best->m_backend).fpclass = (fpclass_type)local_440;
            (best->m_backend).prec_elem = local_440._4_4_;
            local_4dc = iVar5;
          }
        }
        if (local_3b0.fpclass == cpp_dec_float_NaN || (int)uVar8 == 2) {
LAB_005a8ed2:
          if (local_3b0.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_430,0,(type *)0x0);
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b0,&local_430);
            if (iVar5 < 0) goto LAB_005a8f0e;
          }
        }
        else {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_3b0);
          if (-1 < iVar5) {
            goto LAB_005a8ed2;
          }
LAB_005a8f0e:
          puVar11 = (uint *)local_4b8;
          pcVar14 = &local_3b0;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar14->data)._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar18 * -2 + 1;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          local_3b0.exp = iStack_448;
          local_3b0.neg = bStack_444;
          local_3b0.fpclass = (fpclass_type)local_440;
          local_3b0.prec_elem = local_440._4_4_;
        }
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  lVar9 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->updateViolsCo).super_IdxSet.num;
  if (0 < lVar9) {
    uVar10 = lVar9 + 1;
    do {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar6 = (pSVar1->isInfeasibleCo).data;
      iVar5 = (pSVar1->updateViolsCo).super_IdxSet.idx[uVar10 - 2];
      if (piVar6[iVar5] == 1) {
        pnVar12 = pnVar2 + iVar5;
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        iStack_448 = pnVar2[iVar5].m_backend.exp;
        bStack_444 = pnVar2[iVar5].m_backend.neg;
        local_440._0_4_ = pnVar2[iVar5].m_backend.fpclass;
        local_440._4_4_ = pnVar2[iVar5].m_backend.prec_elem;
        pnVar13 = tol;
        pcVar14 = &local_430;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
        }
        local_430.exp = (tol->m_backend).exp;
        local_430.neg = (tol->m_backend).neg;
        local_430.fpclass = (tol->m_backend).fpclass;
        local_430.prec_elem = (tol->m_backend).prec_elem;
        if (local_430.data._M_elems[0] != 0 || local_430.fpclass != 0) {
          local_430.neg = (bool)(local_430.neg ^ 1);
        }
        if ((fpclass_type)local_440 != 2 && local_430.fpclass != 2) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_430);
          if (iVar4 < 0) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
            psVar15 = local_230;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              *(uint *)psVar15 = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
              psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
            }
            local_1c0 = iStack_448;
            local_1bc = bStack_444;
            local_1b8 = local_440;
            pnVar12 = pnVar3 + iVar5;
            pnVar13 = &local_2b0;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
              pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = pnVar3[iVar5].m_backend.exp;
            local_2b0.m_backend.neg = pnVar3[iVar5].m_backend.neg;
            local_2b0.m_backend.fpclass = pnVar3[iVar5].m_backend.fpclass;
            local_2b0.m_backend.prec_elem = pnVar3[iVar5].m_backend.prec_elem;
            pnVar13 = tol;
            pnVar16 = &local_330;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
            }
            local_330.m_backend.exp = (tol->m_backend).exp;
            local_330.m_backend.neg = (tol->m_backend).neg;
            local_330.m_backend.fpclass = (tol->m_backend).fpclass;
            local_330.m_backend.prec_elem = (tol->m_backend).prec_elem;
            steeppr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_430,local_230,&local_2b0,&local_330,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_230);
            pcVar14 = &local_430;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar17->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
            }
            iStack_448 = local_430.exp;
            bStack_444 = local_430.neg;
            local_440._0_4_ = local_430.fpclass;
            local_440._4_4_ = local_430.prec_elem;
            if (((local_430.fpclass != 2) && (local_3b0.fpclass != cpp_dec_float_NaN)) &&
               (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_3b0),
               0 < iVar4)) {
              if ((((fpclass_type)local_440 != cpp_dec_float_NaN) &&
                  ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_4b8,&best->m_backend),
                 0 < iVar4)) {
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
                pnVar13 = best;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pnVar13->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar18 * -8 + 4);
                  pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
                }
                (best->m_backend).exp = iStack_448;
                (best->m_backend).neg = bStack_444;
                (best->m_backend).fpclass = (fpclass_type)local_440;
                (best->m_backend).prec_elem = local_440._4_4_;
                local_4dc = iVar5;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasibleCo).data[iVar5] = 2;
              DIdxSet::addIdx(&this->bestPricesCo,iVar5);
            }
            goto LAB_005a908b;
          }
          piVar6 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->isInfeasibleCo).data;
        }
        piVar6[iVar5] = 0;
      }
LAB_005a908b:
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  if (local_4dc < 0) {
    DVar7.info = 0;
    DVar7.idx = -1;
  }
  else {
    DVar7 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,local_4dc);
  }
  return (SPxId)DVar7;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperCoDim(R& best, R tol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, weights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}